

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testValidateNewOrderSingle(int count)

{
  Header *pHVar1;
  long lVar2;
  long lVar3;
  int local_97c;
  int i;
  long start;
  DataDictionary dataDictionary;
  SEQNUM local_584;
  MsgSeqNum local_580;
  allocator<char> local_519;
  STRING local_518;
  TargetCompID local_4f8;
  allocator<char> local_491;
  STRING local_490;
  SenderCompID local_470;
  undefined1 local_410 [8];
  NewOrderSingle message;
  OrdType ordType;
  TransactTime transactTime;
  Side side;
  STRING local_190;
  undefined1 local_170 [8];
  Symbol symbol;
  undefined1 local_108 [8];
  HandlInst handlInst;
  allocator<char> local_91;
  STRING local_90;
  undefined1 local_70 [8];
  ClOrdID clOrdID;
  int count_local;
  
  clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_ = count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"ORDERID",&local_91);
  FIX::ClOrdID::ClOrdID((ClOrdID *)local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  symbol.super_StringField.super_FieldBase.m_metrics._15_1_ = 0x31;
  FIX::HandlInst::HandlInst
            ((HandlInst *)local_108,&symbol.super_StringField.super_FieldBase.m_metrics.field_0xf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"LNUX",
             (allocator<char> *)&side.super_CharField.super_FieldBase.m_metrics.field_0xf);
  FIX::Symbol::Symbol((Symbol *)local_170,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator
            ((allocator<char> *)&side.super_CharField.super_FieldBase.m_metrics.field_0xf);
  FIX::Side::Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum
                  ,"11");
  FIX::TransactTime::TransactTime
            ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum);
  FIX::OrdType::OrdType((OrdType *)&message.super_Message.field_0x150,"1");
  FIX42::NewOrderSingle::NewOrderSingle
            ((NewOrderSingle *)local_410,(ClOrdID *)local_70,(HandlInst *)local_108,
             (Symbol *)local_170,
             (Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum,
             (TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum,
             (OrdType *)&message.super_Message.field_0x150);
  pHVar1 = FIX42::Message::getHeader((Message *)local_410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"SENDER",&local_491);
  FIX::SenderCompID::SenderCompID(&local_470,&local_490);
  FIX42::Header::set(pHVar1,&local_470);
  FIX::SenderCompID::~SenderCompID(&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  pHVar1 = FIX42::Message::getHeader((Message *)local_410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"TARGET",&local_519);
  FIX::TargetCompID::TargetCompID(&local_4f8,&local_518);
  FIX42::Header::set(pHVar1,&local_4f8);
  FIX::TargetCompID::~TargetCompID(&local_4f8);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  pHVar1 = FIX42::Message::getHeader((Message *)local_410);
  local_584 = 1;
  FIX::MsgSeqNum::MsgSeqNum(&local_580,&local_584);
  FIX42::Header::set(pHVar1,&local_580);
  FIX::MsgSeqNum::~MsgSeqNum(&local_580);
  FIX::DataDictionary::DataDictionary((DataDictionary *)&start);
  clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_ =
       clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_ + -1;
  lVar2 = GetTickCount();
  for (local_97c = 0; local_97c <= (int)clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_;
      local_97c = local_97c + 1) {
    FIX::DataDictionary::validate((DataDictionary *)&start,(Message *)local_410);
  }
  lVar3 = GetTickCount();
  FIX::DataDictionary::~DataDictionary((DataDictionary *)&start);
  FIX42::NewOrderSingle::~NewOrderSingle((NewOrderSingle *)local_410);
  FIX::OrdType::~OrdType((OrdType *)&message.super_Message.field_0x150);
  FIX::TransactTime::~TransactTime
            ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum);
  FIX::Side::~Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.
                            m_checksum);
  FIX::Symbol::~Symbol((Symbol *)local_170);
  FIX::HandlInst::~HandlInst((HandlInst *)local_108);
  FIX::ClOrdID::~ClOrdID((ClOrdID *)local_70);
  return lVar3 - lVar2;
}

Assistant:

long testValidateNewOrderSingle( int count )
{
  FIX::ClOrdID clOrdID( "ORDERID" );
  FIX::HandlInst handlInst( '1' );
  FIX::Symbol symbol( "LNUX" );
  FIX::Side side( FIX::Side_BUY );
  FIX::TransactTime transactTime;
  FIX::OrdType ordType( FIX::OrdType_MARKET );
  FIX42::NewOrderSingle message
  ( clOrdID, handlInst, symbol, side, transactTime, ordType );
  message.getHeader().set( FIX::SenderCompID( "SENDER" ) );
  message.getHeader().set( FIX::TargetCompID( "TARGET" ) );
  message.getHeader().set( FIX::MsgSeqNum( 1 ) );

  FIX::DataDictionary dataDictionary;
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    dataDictionary.validate( message );
  }
  return GetTickCount() - start;
}